

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O1

int mbedtls_mpi_core_write_le(mbedtls_mpi_uint *A,size_t A_limbs,uchar *output,size_t output_length)

{
  size_t __n;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar1 = A_limbs * 8;
  uVar3 = uVar1;
  if ((output_length <= uVar1) && (uVar3 = output_length, output_length < uVar1)) {
    lVar2 = output_length * 8;
    sVar5 = output_length;
    do {
      if ((char)(*(ulong *)((long)A + (sVar5 & 0xfffffffffffffff8)) >> ((byte)lVar2 & 0x38)) != '\0'
         ) {
        return -8;
      }
      sVar5 = sVar5 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar1 != sVar5);
  }
  if (uVar3 != 0) {
    bVar4 = 0;
    uVar6 = 0;
    do {
      output[uVar6] = (uchar)(*(ulong *)((long)A + (uVar6 & 0xfffffffffffffff8)) >> (bVar4 & 0x38));
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar3 != uVar6);
  }
  __n = output_length + A_limbs * -8;
  if (uVar1 <= output_length && __n != 0) {
    memset(output + uVar1,0,__n);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_core_write_le(const mbedtls_mpi_uint *A,
                              size_t A_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes = A_limbs * ciL;
    size_t bytes_to_copy;

    if (stored_bytes < output_length) {
        bytes_to_copy = stored_bytes;
    } else {
        bytes_to_copy = output_length;

        /* The output buffer is smaller than the allocated size of A.
         * However A may fit if its leading bytes are zero. */
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(A, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        output[i] = GET_BYTE(A, i);
    }

    if (stored_bytes < output_length) {
        /* Write trailing 0 bytes */
        memset(output + stored_bytes, 0, output_length - stored_bytes);
    }

    return 0;
}